

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::decomposeStructBufferMethods
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped **node,TIntermNode *arguments)

{
  byte bVar1;
  TIntermediate *pTVar2;
  TSpirvType *pTVar3;
  TType *left;
  bool bVar4;
  int iVar5;
  TOperator TVar6;
  TBasicType t;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar8;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *pvVar9;
  reference ppTVar10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar11;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TVariable *pTVar12;
  TIntermTyped *pTVar13;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  TQualifier *this_00;
  undefined4 extraout_var_10;
  TIntermAggregate *pTVar14;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  size_type sVar15;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  ulong uVar16;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  TIntermBinary *pTVar17;
  TIntermTyped *pTVar18;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  TIntermConstantUnion *pTVar19;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  TIntermAggregate *local_cb8;
  bool local_ba9;
  undefined1 local_b98 [8];
  TType derefType_5;
  TIntermTyped *newCounter;
  TIntermTyped *oldCounter_1;
  TType derefType_4;
  TIntermTyped *rValue_1;
  TIntermTyped *lValue_1;
  TIntermTyped *oldCounter;
  TIntermTyped *preIncValue;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_a30;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_a28;
  const_iterator local_a20;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_a18;
  const_iterator local_a10;
  undefined1 local_a08 [8];
  TType derefType_3;
  TIntermTyped *element;
  undefined1 local_960 [4];
  TOperator idxOp_3;
  TIntermBinary *local_8c8;
  TIntermTyped *argIndex_3;
  TIntermSequence *sequence;
  TIntermTyped *assign_3;
  int stride;
  int size_2;
  TIntermTyped *assign_2;
  TIntermTyped *lengthCall;
  TIntermTyped *assign_1;
  TIntermAggregate *pTStack_888;
  int length;
  TIntermAggregate *body_2;
  TIntermTyped *argStride;
  TIntermTyped *argNumItems;
  TIntermTyped *pTStack_868;
  int numArgs;
  TIntermTyped *assign;
  TType indexType;
  TIntermTyped *rValue;
  TType derefType_2;
  TIntermTyped *lValue;
  undefined1 local_718 [4];
  TOperator idxOp_2;
  TIntermConstantUnion *local_680;
  TIntermTyped *idxConst;
  TIntermTyped *offsetIdx_1;
  TIntermSymbol *pTStack_668;
  int idx_1;
  TIntermTyped *byteAddrIdxVar_1;
  TVariable *local_5c8;
  TVariable *byteAddrSym_1;
  TIntermBinary *local_528;
  TIntermTyped *byteAddrIdx_1;
  TIntermAggregate *body_1;
  TIntermTyped *pTStack_510;
  int size_1;
  TIntermTyped *argValue;
  TIntermTyped *argIndex_2;
  undefined1 local_468 [8];
  TType derefType_1;
  TIntermTyped *indexVal;
  undefined1 local_3c0 [4];
  TOperator idxOp_1;
  TIntermBinary *local_328;
  TIntermTyped *offsetIdx;
  TIntermAggregate *pTStack_318;
  int idx;
  TIntermTyped *vec;
  TIntermTyped *byteAddrIdxVar;
  TVariable *local_270;
  TVariable *byteAddrSym;
  TIntermBinary *local_1d0;
  TIntermTyped *byteAddrIdx;
  TIntermTyped *body;
  int size;
  TOperator constructOp;
  TIntermTyped *argIndex_1;
  TType derefType;
  undefined1 local_110 [4];
  TOperator idxOp;
  bool local_75;
  uint local_74;
  bool isByteAddressBuffer;
  long *plStack_70;
  TBuiltInVariable builtInType;
  TType *bufferType;
  TIntermTyped *argIndex;
  TIntermTyped *argArray;
  anon_class_24_3_252b1faa incDecCounter;
  TIntermTyped *bufferObj;
  TIntermAggregate *argAggregate;
  TOperator op;
  TIntermNode *arguments_local;
  TIntermTyped **node_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  undefined4 extraout_var_01;
  
  if (((*node != (TIntermTyped *)0x0) &&
      (iVar5 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[4])(),
      CONCAT44(extraout_var,iVar5) != 0)) && (arguments != (TIntermNode *)0x0)) {
    iVar5 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[4])();
    TVar6 = TIntermOperator::getOp((TIntermOperator *)CONCAT44(extraout_var_00,iVar5));
    iVar5 = (*arguments->_vptr_TIntermNode[6])();
    plVar8 = (long *)CONCAT44(extraout_var_01,iVar5);
    incDecCounter.bufferObj = (TIntermTyped **)0x0;
    if (plVar8 == (long *)0x0) {
      iVar5 = (*arguments->_vptr_TIntermNode[0xc])();
      incDecCounter.bufferObj = (TIntermTyped **)CONCAT44(extraout_var_03,iVar5);
    }
    else {
      pvVar9 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
               (**(code **)(*plVar8 + 400))();
      bVar4 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::empty(pvVar9);
      if (bVar4) {
        return;
      }
      pvVar9 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
               (**(code **)(*plVar8 + 400))();
      ppTVar10 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                           (pvVar9,0);
      if (*ppTVar10 != (value_type)0x0) {
        pvVar9 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                 (**(code **)(*plVar8 + 400))();
        ppTVar10 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                             (pvVar9,0);
        iVar5 = (*(*ppTVar10)->_vptr_TIntermNode[3])();
        incDecCounter.bufferObj = (TIntermTyped **)CONCAT44(extraout_var_02,iVar5);
      }
    }
    if ((incDecCounter.bufferObj != (TIntermTyped **)0x0) &&
       (lVar11 = (**(code **)&((*incDecCounter.bufferObj)->type).qualifier.layoutViewportRelative)()
       , lVar11 != 0)) {
      incDecCounter.loc = (TSourceLoc *)&incDecCounter.bufferObj;
      argArray = (TIntermTyped *)this;
      incDecCounter.this = (HlslParseContext *)loc;
      argIndex = indexStructBufferContent(this,loc,(TIntermTyped *)incDecCounter.bufferObj);
      if (argIndex != (TIntermTyped *)0x0) {
        switch(TVar6) {
        case EOpInterlockedAdd:
        case EOpInterlockedAnd:
        case EOpInterlockedCompareExchange:
        case EOpInterlockedCompareStore:
        case EOpInterlockedExchange:
        case EOpInterlockedMax:
        case EOpInterlockedMin:
        case EOpInterlockedOr:
        case EOpInterlockedXor:
          argIndex_3 = (TIntermTyped *)(**(code **)(*plVar8 + 400))();
          ppTVar10 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                               ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                                argIndex_3,1);
          iVar5 = (*(*ppTVar10)->_vptr_TIntermNode[3])();
          pTVar18 = makeIntegerIndex(this,(TIntermTyped *)CONCAT44(extraout_var_26,iVar5));
          pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          local_8c8 = (TIntermBinary *)pTVar18;
          pTVar19 = TIntermediate::addConstantUnion
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,2,
                               loc,true);
          TType::TType((TType *)local_960,EbtInt,EvqTemporary,1,0,0,false);
          local_8c8 = TIntermediate::addBinaryNode
                                (pTVar2,EOpRightShift,pTVar18,&pTVar19->super_TIntermTyped,loc,
                                 (TType *)local_960);
          TType::~TType((TType *)local_960);
          iVar5 = (*(local_8c8->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x21])();
          TVar6 = EOpIndexIndirect;
          if (((uint)*(undefined8 *)(CONCAT44(extraout_var_27,iVar5) + 8) & 0x7f) == 2) {
            TVar6 = EOpIndexDirect;
          }
          derefType_3.spirvType =
               (TSpirvType *)
               TIntermediate::addIndex
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,TVar6,
                          argIndex,(TIntermTyped *)local_8c8,loc);
          iVar5 = (*(argIndex->super_TIntermNode)._vptr_TIntermNode[0x1e])();
          TType::TType((TType *)local_a08,(TType *)CONCAT44(extraout_var_28,iVar5),0,false);
          (*(code *)((derefType_3.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                    allocator[2].freeList)(derefType_3.spirvType,local_a08);
          pTVar3 = derefType_3.spirvType;
          ppTVar10 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                               ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                                argIndex_3,1);
          pTVar18 = argIndex_3;
          *ppTVar10 = (value_type)pTVar3;
          local_a18._M_current =
               (TIntermNode **)
               std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                         ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                          argIndex_3);
          __gnu_cxx::
          __normal_iterator<TIntermNode*const*,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>
          ::__normal_iterator<TIntermNode**>
                    ((__normal_iterator<TIntermNode*const*,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>
                      *)&local_a10,&local_a18);
          local_a30._M_current =
               (TIntermNode **)
               std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                         ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                          argIndex_3);
          local_a28 = __gnu_cxx::
                      __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                      ::operator+(&local_a30,1);
          __gnu_cxx::
          __normal_iterator<TIntermNode*const*,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>
          ::__normal_iterator<TIntermNode**>
                    ((__normal_iterator<TIntermNode*const*,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>
                      *)&local_a20,&local_a28);
          std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::erase
                    ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)pTVar18,
                     local_a10,local_a20);
          TType::~TType((TType *)local_a08);
          break;
        default:
          break;
        case EOpMethodLoad:
          pvVar9 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                   (**(code **)(*plVar8 + 400))();
          ppTVar10 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                               (pvVar9,1);
          iVar5 = (*(*ppTVar10)->_vptr_TIntermNode[3])();
          bufferType = (TType *)makeIntegerIndex(this,(TIntermTyped *)
                                                      CONCAT44(extraout_var_04,iVar5));
          plStack_70 = (long *)(**(code **)&(*incDecCounter.bufferObj)[1].type.qualifier.field_0x8)
                                         ();
          lVar11 = (**(code **)(*plStack_70 + 0x58))();
          left = bufferType;
          local_74 = (uint)((ulong)*(undefined8 *)(lVar11 + 8) >> 0x10) & 0x1ff;
          local_ba9 = local_74 == 0x99 || local_74 == 0x9a;
          local_75 = local_ba9;
          if (local_74 == 0x99 || local_74 == 0x9a) {
            pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            pTVar19 = TIntermediate::addConstantUnion
                                ((this->super_TParseContextBase).super_TParseVersions.intermediate,2
                                 ,loc,true);
            TType::TType((TType *)local_110,EbtInt,EvqTemporary,1,0,0,false);
            bufferType = (TType *)TIntermediate::addBinaryNode
                                            (pTVar2,EOpRightShift,(TIntermTyped *)left,
                                             &pTVar19->super_TIntermTyped,loc,(TType *)local_110);
            TType::~TType((TType *)local_110);
          }
          iVar5 = (*bufferType->_vptr_TType[0x21])();
          derefType.spirvType._4_4_ = EOpIndexIndirect;
          if (((uint)*(undefined8 *)(CONCAT44(extraout_var_05,iVar5) + 8) & 0x7f) == 2) {
            derefType.spirvType._4_4_ = EOpIndexDirect;
          }
          pTVar18 = TIntermediate::addIndex
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               derefType.spirvType._4_4_,argIndex,(TIntermTyped *)bufferType,loc);
          *node = pTVar18;
          iVar5 = (*(argIndex->super_TIntermNode)._vptr_TIntermNode[0x1e])();
          TType::TType((TType *)&argIndex_1,(TType *)CONCAT44(extraout_var_06,iVar5),0,false);
          (*((*node)->super_TIntermNode)._vptr_TIntermNode[0x1d])(*node,&argIndex_1);
          TType::~TType((TType *)&argIndex_1);
          break;
        case EOpMethodGetDimensions:
          pvVar9 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                   (**(code **)(*plVar8 + 400))();
          sVar15 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvVar9)
          ;
          argNumItems._4_4_ = (int)sVar15;
          pvVar9 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                   (**(code **)(*plVar8 + 400))();
          ppTVar10 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                               (pvVar9,1);
          iVar5 = (*(*ppTVar10)->_vptr_TIntermNode[3])();
          argStride = (TIntermTyped *)CONCAT44(extraout_var_18,iVar5);
          if (argNumItems._4_4_ < 3) {
            local_cb8 = (TIntermAggregate *)0x0;
          }
          else {
            pvVar9 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                     (**(code **)(*plVar8 + 400))();
            ppTVar10 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                       operator[](pvVar9,2);
            iVar5 = (*(*ppTVar10)->_vptr_TIntermNode[3])();
            local_cb8 = (TIntermAggregate *)CONCAT44(extraout_var_19,iVar5);
          }
          body_2 = local_cb8;
          pTStack_888 = (TIntermAggregate *)0x0;
          iVar5 = (*(argIndex->super_TIntermNode)._vptr_TIntermNode[0x1e])();
          uVar16 = (**(code **)(*(long *)CONCAT44(extraout_var_20,iVar5) + 0xf0))();
          pTVar18 = argIndex;
          if ((uVar16 & 1) == 0) {
            pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            iVar5 = (*(argStride->super_TIntermNode)._vptr_TIntermNode[0x1e])();
            assign_2 = TIntermediate::addBuiltInFunctionCall
                                 (pTVar2,loc,EOpArrayLength,true,&pTVar18->super_TIntermNode,
                                  (TType *)CONCAT44(extraout_var_22,iVar5));
            _stride = TIntermediate::addAssign
                                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                 EOpAssign,argStride,assign_2,loc);
            pTStack_888 = TIntermediate::growAggregate
                                    ((this->super_TParseContextBase).super_TParseVersions.
                                     intermediate,(TIntermNode *)pTStack_888,
                                     &_stride->super_TIntermNode,loc);
          }
          else {
            iVar5 = (*(argIndex->super_TIntermNode)._vptr_TIntermNode[0x1e])();
            assign_1._4_4_ = (**(code **)(*(long *)CONCAT44(extraout_var_21,iVar5) + 0x78))();
            pTVar18 = argStride;
            pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            pTVar19 = TIntermediate::addConstantUnion
                                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                 assign_1._4_4_,loc,true);
            lengthCall = TIntermediate::addAssign
                                   (pTVar2,EOpAssign,pTVar18,&pTVar19->super_TIntermTyped,loc);
            pTStack_888 = TIntermediate::growAggregate
                                    ((this->super_TParseContextBase).super_TParseVersions.
                                     intermediate,(TIntermNode *)pTStack_888,
                                     &lengthCall->super_TIntermNode,loc);
          }
          if (body_2 != (TIntermAggregate *)0x0) {
            iVar5 = (*(argIndex->super_TIntermNode)._vptr_TIntermNode[0x1e])();
            iVar7 = (*(argIndex->super_TIntermNode)._vptr_TIntermNode[0x1e])();
            lVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_24,iVar7) + 0x58))();
            bVar1 = *(byte *)(lVar11 + 0x10);
            iVar7 = (*(argIndex->super_TIntermNode)._vptr_TIntermNode[0x1e])();
            lVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_25,iVar7) + 0x58))();
            TIntermediate::getMemberAlignment
                      ((TType *)CONCAT44(extraout_var_23,iVar5),(int *)((long)&assign_3 + 4),
                       (int *)&assign_3,(uint)(bVar1 & 0xf),
                       (uint)((ulong)*(undefined8 *)(lVar11 + 8) >> 0x3d) == 1);
            pTVar14 = body_2;
            pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            pTVar19 = TIntermediate::addConstantUnion
                                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                 (int)assign_3,loc,true);
            sequence = (TIntermSequence *)
                       TIntermediate::addAssign
                                 (pTVar2,EOpAssign,(TIntermTyped *)pTVar14,
                                  &pTVar19->super_TIntermTyped,loc);
            pTStack_888 = TIntermediate::growAggregate
                                    ((this->super_TParseContextBase).super_TParseVersions.
                                     intermediate,(TIntermNode *)pTStack_888,(TIntermNode *)sequence
                                    );
          }
          (*(pTStack_888->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
            _vptr_TIntermNode[0x31])(pTStack_888,1);
          *node = (TIntermTyped *)pTStack_888;
          break;
        case EOpMethodLoad2:
        case EOpMethodLoad3:
        case EOpMethodLoad4:
          pvVar9 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                   (**(code **)(*plVar8 + 400))();
          ppTVar10 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                               (pvVar9,1);
          iVar5 = (*(*ppTVar10)->_vptr_TIntermNode[3])();
          pTVar18 = makeIntegerIndex(this,(TIntermTyped *)CONCAT44(extraout_var_07,iVar5));
          body._4_4_ = 0;
          body._0_4_ = 0;
          _size = pTVar18;
          if (TVar6 == EOpMethodLoad2) {
            body._0_4_ = 2;
            body._4_4_ = 0x17b;
          }
          else if (TVar6 == EOpMethodLoad3) {
            body._0_4_ = 3;
            body._4_4_ = 0x17c;
          }
          else {
            if (TVar6 != EOpMethodLoad4) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                            ,0xde6,
                            "void glslang::HlslParseContext::decomposeStructBufferMethods(const TSourceLoc &, TIntermTyped *&, TIntermNode *)"
                           );
            }
            body._0_4_ = 4;
            body._4_4_ = 0x17d;
          }
          byteAddrIdx = (TIntermTyped *)0x0;
          pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          pTVar19 = TIntermediate::addConstantUnion
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,2,
                               loc,true);
          TType::TType((TType *)&byteAddrSym,EbtInt,EvqTemporary,1,0,0,false);
          pTVar17 = TIntermediate::addBinaryNode
                              (pTVar2,EOpRightShift,pTVar18,&pTVar19->super_TIntermTyped,loc,
                               (TType *)&byteAddrSym);
          TType::~TType((TType *)&byteAddrSym);
          local_1d0 = pTVar17;
          TType::TType((TType *)&byteAddrIdxVar,EbtInt,EvqTemporary,1,0,0,false);
          pTVar12 = makeInternalVariable(this,"byteAddrTemp",(TType *)&byteAddrIdxVar);
          TType::~TType((TType *)&byteAddrIdxVar);
          local_270 = pTVar12;
          vec = &TIntermediate::addSymbol
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            pTVar12,loc)->super_TIntermTyped;
          pTVar18 = byteAddrIdx;
          pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          pTVar13 = TIntermediate::addAssign
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               EOpAssign,vec,(TIntermTyped *)local_1d0,loc);
          byteAddrIdx = (TIntermTyped *)
                        TIntermediate::growAggregate
                                  (pTVar2,&pTVar18->super_TIntermNode,&pTVar13->super_TIntermNode);
          pTStack_318 = (TIntermAggregate *)0x0;
          for (offsetIdx._4_4_ = 0; pTVar18 = vec, pTVar14 = pTStack_318,
              offsetIdx._4_4_ < (int)body; offsetIdx._4_4_ = offsetIdx._4_4_ + 1) {
            local_328 = (TIntermBinary *)vec;
            if (offsetIdx._4_4_ != 0) {
              pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
              pTVar19 = TIntermediate::addConstantUnion
                                  ((this->super_TParseContextBase).super_TParseVersions.intermediate
                                   ,offsetIdx._4_4_,loc,true);
              TType::TType((TType *)local_3c0,EbtInt,EvqTemporary,1,0,0,false);
              local_328 = TIntermediate::addBinaryNode
                                    (pTVar2,EOpAdd,pTVar18,&pTVar19->super_TIntermTyped,loc,
                                     (TType *)local_3c0);
              TType::~TType((TType *)local_3c0);
            }
            iVar5 = (*(local_328->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x21])();
            TVar6 = EOpIndexIndirect;
            if (((uint)*(undefined8 *)(CONCAT44(extraout_var_08,iVar5) + 8) & 0x7f) == 2) {
              TVar6 = EOpIndexDirect;
            }
            derefType_1.spirvType =
                 (TSpirvType *)
                 TIntermediate::addIndex
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,TVar6,
                            argIndex,(TIntermTyped *)local_328,loc);
            iVar5 = (*(argIndex->super_TIntermNode)._vptr_TIntermNode[0x1e])();
            TType::TType((TType *)local_468,(TType *)CONCAT44(extraout_var_09,iVar5),0,false);
            this_00 = TType::getQualifier((TType *)local_468);
            TQualifier::makeTemporary(this_00);
            (*(code *)((derefType_1.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                      allocator[2].freeList)(derefType_1.spirvType,local_468);
            pTStack_318 = TIntermediate::growAggregate
                                    ((this->super_TParseContextBase).super_TParseVersions.
                                     intermediate,(TIntermNode *)pTStack_318,
                                     (TIntermNode *)derefType_1.spirvType);
            TType::~TType((TType *)local_468);
          }
          t = (*(argIndex->super_TIntermNode)._vptr_TIntermNode[0x20])();
          TType::TType((TType *)&argIndex_2,t,EvqTemporary,(int)body,0,0,false);
          (*(pTVar14->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x1d])(pTVar14,&argIndex_2);
          TType::~TType((TType *)&argIndex_2);
          iVar5 = (*(pTStack_318->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[6])();
          (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar5) + 0x188))
                    ((long *)CONCAT44(extraout_var_10,iVar5),body._4_4_);
          pTVar14 = TIntermediate::growAggregate
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               &byteAddrIdx->super_TIntermNode,(TIntermNode *)pTStack_318);
          byteAddrIdx = (TIntermTyped *)pTVar14;
          iVar5 = (*(pTStack_318->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x1e])();
          (*(pTVar14->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x1d])(pTVar14,CONCAT44(extraout_var_11,iVar5));
          iVar5 = (*(byteAddrIdx->super_TIntermNode)._vptr_TIntermNode[6])();
          (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar5) + 0x188))
                    ((long *)CONCAT44(extraout_var_12,iVar5),1);
          *node = byteAddrIdx;
          break;
        case EOpMethodStore:
        case EOpMethodStore2:
        case EOpMethodStore3:
        case EOpMethodStore4:
          pvVar9 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                   (**(code **)(*plVar8 + 400))();
          ppTVar10 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                               (pvVar9,1);
          iVar5 = (*(*ppTVar10)->_vptr_TIntermNode[3])();
          argValue = makeIntegerIndex(this,(TIntermTyped *)CONCAT44(extraout_var_13,iVar5));
          pvVar9 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                   (**(code **)(*plVar8 + 400))();
          ppTVar10 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                               (pvVar9,2);
          iVar5 = (*(*ppTVar10)->_vptr_TIntermNode[3])();
          pTVar18 = argValue;
          pTStack_510 = (TIntermTyped *)CONCAT44(extraout_var_14,iVar5);
          body_1._4_4_ = 0;
          switch(TVar6) {
          case EOpMethodStore:
            body_1._4_4_ = 1;
            break;
          case EOpMethodStore2:
            body_1._4_4_ = 2;
            break;
          case EOpMethodStore3:
            body_1._4_4_ = 3;
            break;
          case EOpMethodStore4:
            body_1._4_4_ = 4;
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                          ,0xe2e,
                          "void glslang::HlslParseContext::decomposeStructBufferMethods(const TSourceLoc &, TIntermTyped *&, TIntermNode *)"
                         );
          }
          byteAddrIdx_1 = (TIntermTyped *)0x0;
          pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          pTVar19 = TIntermediate::addConstantUnion
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,2,
                               loc,true);
          TType::TType((TType *)&byteAddrSym_1,EbtInt,EvqTemporary,1,0,0,false);
          pTVar17 = TIntermediate::addBinaryNode
                              (pTVar2,EOpRightShift,pTVar18,&pTVar19->super_TIntermTyped,loc,
                               (TType *)&byteAddrSym_1);
          TType::~TType((TType *)&byteAddrSym_1);
          local_528 = pTVar17;
          TType::TType((TType *)&byteAddrIdxVar_1,EbtInt,EvqTemporary,1,0,0,false);
          pTVar12 = makeInternalVariable(this,"byteAddrTemp",(TType *)&byteAddrIdxVar_1);
          TType::~TType((TType *)&byteAddrIdxVar_1);
          local_5c8 = pTVar12;
          pTStack_668 = TIntermediate::addSymbol
                                  ((this->super_TParseContextBase).super_TParseVersions.intermediate
                                   ,pTVar12,loc);
          pTVar18 = byteAddrIdx_1;
          pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          pTVar13 = TIntermediate::addAssign
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               EOpAssign,&pTStack_668->super_TIntermTyped,(TIntermTyped *)local_528,
                               loc);
          byteAddrIdx_1 =
               (TIntermTyped *)
               TIntermediate::growAggregate
                         (pTVar2,&pTVar18->super_TIntermNode,&pTVar13->super_TIntermNode);
          for (offsetIdx_1._4_4_ = 0; offsetIdx_1._4_4_ < body_1._4_4_;
              offsetIdx_1._4_4_ = offsetIdx_1._4_4_ + 1) {
            idxConst = &pTStack_668->super_TIntermTyped;
            pTVar19 = TIntermediate::addConstantUnion
                                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                 offsetIdx_1._4_4_,loc,true);
            pTVar18 = idxConst;
            local_680 = pTVar19;
            if (offsetIdx_1._4_4_ != 0) {
              pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
              TType::TType((TType *)local_718,EbtInt,EvqTemporary,1,0,0,false);
              idxConst = (TIntermTyped *)
                         TIntermediate::addBinaryNode
                                   (pTVar2,EOpAdd,pTVar18,&pTVar19->super_TIntermTyped,loc,
                                    (TType *)local_718);
              TType::~TType((TType *)local_718);
            }
            iVar5 = (*(idxConst->super_TIntermNode)._vptr_TIntermNode[0x21])();
            TVar6 = EOpIndexIndirect;
            if (((uint)*(undefined8 *)(CONCAT44(extraout_var_15,iVar5) + 8) & 0x7f) == 2) {
              TVar6 = EOpIndexDirect;
            }
            derefType_2.spirvType =
                 (TSpirvType *)
                 TIntermediate::addIndex
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,TVar6,
                            argIndex,idxConst,loc);
            iVar5 = (*(argIndex->super_TIntermNode)._vptr_TIntermNode[0x1e])();
            TType::TType((TType *)&rValue,(TType *)CONCAT44(extraout_var_16,iVar5),0,false);
            (*(code *)((derefType_2.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                      allocator[2].freeList)(derefType_2.spirvType,&rValue);
            if (body_1._4_4_ == 1) {
              indexType.spirvType = (TSpirvType *)pTStack_510;
            }
            else {
              indexType.spirvType =
                   (TSpirvType *)
                   TIntermediate::addIndex
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                              EOpIndexDirect,pTStack_510,&local_680->super_TIntermTyped,loc);
              iVar5 = (*(pTStack_510->super_TIntermNode)._vptr_TIntermNode[0x1e])();
              TType::TType((TType *)&assign,(TType *)CONCAT44(extraout_var_17,iVar5),0,false);
              (*(code *)((indexType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                        allocator[2].freeList)(indexType.spirvType,&assign);
              TType::~TType((TType *)&assign);
            }
            pTStack_868 = TIntermediate::addAssign
                                    ((this->super_TParseContextBase).super_TParseVersions.
                                     intermediate,EOpAssign,(TIntermTyped *)derefType_2.spirvType,
                                     (TIntermTyped *)indexType.spirvType,loc);
            byteAddrIdx_1 =
                 (TIntermTyped *)
                 TIntermediate::growAggregate
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            &byteAddrIdx_1->super_TIntermNode,&pTStack_868->super_TIntermNode);
            TType::~TType((TType *)&rValue);
          }
          (*(byteAddrIdx_1->super_TIntermNode)._vptr_TIntermNode[0x31])(byteAddrIdx_1,1);
          *node = byteAddrIdx_1;
          break;
        case EOpMethodIncrementCounter:
          pTVar18 = decomposeStructBufferMethods::anon_class_24_3_252b1faa::operator()
                              ((anon_class_24_3_252b1faa *)&argArray,1);
          *node = pTVar18;
          break;
        case EOpMethodDecrementCounter:
          pTVar18 = decomposeStructBufferMethods::anon_class_24_3_252b1faa::operator()
                              ((anon_class_24_3_252b1faa *)&argArray,-1);
          pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          pTVar19 = TIntermediate::addConstantUnion
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,-1,
                               loc,true);
          iVar5 = (*(pTVar18->super_TIntermNode)._vptr_TIntermNode[0x1e])();
          pTVar17 = TIntermediate::addBinaryNode
                              (pTVar2,EOpAdd,pTVar18,&pTVar19->super_TIntermTyped,loc,
                               (TType *)CONCAT44(extraout_var_29,iVar5));
          *node = (TIntermTyped *)pTVar17;
          break;
        case EOpMethodConsume:
          pTVar18 = decomposeStructBufferMethods::anon_class_24_3_252b1faa::operator()
                              ((anon_class_24_3_252b1faa *)&argArray,-1);
          pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          pTVar19 = TIntermediate::addConstantUnion
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,-1,
                               loc,true);
          iVar5 = (*(pTVar18->super_TIntermNode)._vptr_TIntermNode[0x1e])();
          derefType_5.spirvType =
               (TSpirvType *)
               TIntermediate::addBinaryNode
                         (pTVar2,EOpAdd,pTVar18,&pTVar19->super_TIntermTyped,loc,
                          (TType *)CONCAT44(extraout_var_32,iVar5));
          pTVar18 = TIntermediate::addIndex
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               EOpIndexIndirect,argIndex,(TIntermTyped *)derefType_5.spirvType,loc);
          *node = pTVar18;
          iVar5 = (*(argIndex->super_TIntermNode)._vptr_TIntermNode[0x1e])();
          TType::TType((TType *)local_b98,(TType *)CONCAT44(extraout_var_33,iVar5),0,false);
          (*((*node)->super_TIntermNode)._vptr_TIntermNode[0x1d])(*node,local_b98);
          TType::~TType((TType *)local_b98);
          break;
        case EOpMethodAppend:
          pTVar18 = decomposeStructBufferMethods::anon_class_24_3_252b1faa::operator()
                              ((anon_class_24_3_252b1faa *)&argArray,1);
          pTVar18 = TIntermediate::addIndex
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               EOpIndexIndirect,argIndex,pTVar18,loc);
          pvVar9 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                   (**(code **)(*plVar8 + 400))();
          ppTVar10 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                               (pvVar9,1);
          iVar5 = (*(*ppTVar10)->_vptr_TIntermNode[3])();
          derefType_4.spirvType = (TSpirvType *)CONCAT44(extraout_var_30,iVar5);
          iVar5 = (*(argIndex->super_TIntermNode)._vptr_TIntermNode[0x1e])();
          TType::TType((TType *)&oldCounter_1,(TType *)CONCAT44(extraout_var_31,iVar5),0,false);
          (*(pTVar18->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar18,&oldCounter_1);
          pTVar18 = TIntermediate::addAssign
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               EOpAssign,pTVar18,(TIntermTyped *)derefType_4.spirvType,loc);
          *node = pTVar18;
          TType::~TType((TType *)&oldCounter_1);
        }
      }
    }
  }
  return;
}

Assistant:

void HlslParseContext::decomposeStructBufferMethods(const TSourceLoc& loc, TIntermTyped*& node, TIntermNode* arguments)
{
    if (node == nullptr || node->getAsOperator() == nullptr || arguments == nullptr)
        return;

    const TOperator op  = node->getAsOperator()->getOp();
    TIntermAggregate* argAggregate = arguments->getAsAggregate();

    // Buffer is the object upon which method is called, so always arg 0
    TIntermTyped* bufferObj = nullptr;

    // The parameters can be an aggregate, or just a the object as a symbol if there are no fn params.
    if (argAggregate) {
        if (argAggregate->getSequence().empty())
            return;
        if (argAggregate->getSequence()[0])
            bufferObj = argAggregate->getSequence()[0]->getAsTyped();
    } else {
        bufferObj = arguments->getAsSymbolNode();
    }

    if (bufferObj == nullptr || bufferObj->getAsSymbolNode() == nullptr)
        return;

    // Some methods require a hidden internal counter, obtained via getStructBufferCounter().
    // This lambda adds something to it and returns the old value.
    const auto incDecCounter = [&](int incval) -> TIntermTyped* {
        TIntermTyped* incrementValue = intermediate.addConstantUnion(static_cast<unsigned int>(incval), loc, true);
        TIntermTyped* counter = getStructBufferCounter(loc, bufferObj); // obtain the counter member

        if (counter == nullptr)
            return nullptr;

        TIntermAggregate* counterIncrement = new TIntermAggregate(EOpAtomicAdd);
        counterIncrement->setType(TType(EbtUint, EvqTemporary));
        counterIncrement->setLoc(loc);
        counterIncrement->getSequence().push_back(counter);
        counterIncrement->getSequence().push_back(incrementValue);

        return counterIncrement;
    };

    // Index to obtain the runtime sized array out of the buffer.
    TIntermTyped* argArray = indexStructBufferContent(loc, bufferObj);
    if (argArray == nullptr)
        return;  // It might not be a struct buffer method.

    switch (op) {
    case EOpMethodLoad:
        {
            TIntermTyped* argIndex = makeIntegerIndex(argAggregate->getSequence()[1]->getAsTyped());  // index

            const TType& bufferType = bufferObj->getType();

            const TBuiltInVariable builtInType = bufferType.getQualifier().declaredBuiltIn;

            // Byte address buffers index in bytes (only multiples of 4 permitted... not so much a byte address
            // buffer then, but that's what it calls itself.
            const bool isByteAddressBuffer = (builtInType == EbvByteAddressBuffer   ||
                                              builtInType == EbvRWByteAddressBuffer);


            if (isByteAddressBuffer)
                argIndex = intermediate.addBinaryNode(EOpRightShift, argIndex,
                                                      intermediate.addConstantUnion(2, loc, true),
                                                      loc, TType(EbtInt));

            // Index into the array to find the item being loaded.
            const TOperator idxOp = (argIndex->getQualifier().storage == EvqConst) ? EOpIndexDirect : EOpIndexIndirect;

            node = intermediate.addIndex(idxOp, argArray, argIndex, loc);

            const TType derefType(argArray->getType(), 0);
            node->setType(derefType);
        }

        break;

    case EOpMethodLoad2:
    case EOpMethodLoad3:
    case EOpMethodLoad4:
        {
            TIntermTyped* argIndex = makeIntegerIndex(argAggregate->getSequence()[1]->getAsTyped());  // index

            TOperator constructOp = EOpNull;
            int size = 0;

            switch (op) {
            case EOpMethodLoad2: size = 2; constructOp = EOpConstructVec2; break;
            case EOpMethodLoad3: size = 3; constructOp = EOpConstructVec3; break;
            case EOpMethodLoad4: size = 4; constructOp = EOpConstructVec4; break;
            default: assert(0);
            }

            TIntermTyped* body = nullptr;

            // First, we'll store the address in a variable to avoid multiple shifts
            // (we must convert the byte address to an item address)
            TIntermTyped* byteAddrIdx = intermediate.addBinaryNode(EOpRightShift, argIndex,
                                                                   intermediate.addConstantUnion(2, loc, true),
                                                                   loc, TType(EbtInt));

            TVariable* byteAddrSym = makeInternalVariable("byteAddrTemp", TType(EbtInt, EvqTemporary));
            TIntermTyped* byteAddrIdxVar = intermediate.addSymbol(*byteAddrSym, loc);

            body = intermediate.growAggregate(body, intermediate.addAssign(EOpAssign, byteAddrIdxVar, byteAddrIdx, loc));

            TIntermTyped* vec = nullptr;

            // These are only valid on (rw)byteaddressbuffers, so we can always perform the >>2
            // address conversion.
            for (int idx=0; idx<size; ++idx) {
                TIntermTyped* offsetIdx = byteAddrIdxVar;

                // add index offset
                if (idx != 0)
                    offsetIdx = intermediate.addBinaryNode(EOpAdd, offsetIdx,
                                                           intermediate.addConstantUnion(idx, loc, true),
                                                           loc, TType(EbtInt));

                const TOperator idxOp = (offsetIdx->getQualifier().storage == EvqConst) ? EOpIndexDirect
                                                                                        : EOpIndexIndirect;

                TIntermTyped* indexVal = intermediate.addIndex(idxOp, argArray, offsetIdx, loc);

                TType derefType(argArray->getType(), 0);
                derefType.getQualifier().makeTemporary();
                indexVal->setType(derefType);

                vec = intermediate.growAggregate(vec, indexVal);
            }

            vec->setType(TType(argArray->getBasicType(), EvqTemporary, size));
            vec->getAsAggregate()->setOperator(constructOp);

            body = intermediate.growAggregate(body, vec);
            body->setType(vec->getType());
            body->getAsAggregate()->setOperator(EOpSequence);

            node = body;
        }

        break;

    case EOpMethodStore:
    case EOpMethodStore2:
    case EOpMethodStore3:
    case EOpMethodStore4:
        {
            TIntermTyped* argIndex = makeIntegerIndex(argAggregate->getSequence()[1]->getAsTyped());  // index
            TIntermTyped* argValue = argAggregate->getSequence()[2]->getAsTyped();  // value

            // Index into the array to find the item being loaded.
            // Byte address buffers index in bytes (only multiples of 4 permitted... not so much a byte address
            // buffer then, but that's what it calls itself).

            int size = 0;

            switch (op) {
            case EOpMethodStore:  size = 1; break;
            case EOpMethodStore2: size = 2; break;
            case EOpMethodStore3: size = 3; break;
            case EOpMethodStore4: size = 4; break;
            default: assert(0);
            }

            TIntermAggregate* body = nullptr;

            // First, we'll store the address in a variable to avoid multiple shifts
            // (we must convert the byte address to an item address)
            TIntermTyped* byteAddrIdx = intermediate.addBinaryNode(EOpRightShift, argIndex,
                                                                   intermediate.addConstantUnion(2, loc, true), loc, TType(EbtInt));

            TVariable* byteAddrSym = makeInternalVariable("byteAddrTemp", TType(EbtInt, EvqTemporary));
            TIntermTyped* byteAddrIdxVar = intermediate.addSymbol(*byteAddrSym, loc);

            body = intermediate.growAggregate(body, intermediate.addAssign(EOpAssign, byteAddrIdxVar, byteAddrIdx, loc));

            for (int idx=0; idx<size; ++idx) {
                TIntermTyped* offsetIdx = byteAddrIdxVar;
                TIntermTyped* idxConst = intermediate.addConstantUnion(idx, loc, true);

                // add index offset
                if (idx != 0)
                    offsetIdx = intermediate.addBinaryNode(EOpAdd, offsetIdx, idxConst, loc, TType(EbtInt));

                const TOperator idxOp = (offsetIdx->getQualifier().storage == EvqConst) ? EOpIndexDirect
                                                                                        : EOpIndexIndirect;

                TIntermTyped* lValue = intermediate.addIndex(idxOp, argArray, offsetIdx, loc);
                const TType derefType(argArray->getType(), 0);
                lValue->setType(derefType);

                TIntermTyped* rValue;
                if (size == 1) {
                    rValue = argValue;
                } else {
                    rValue = intermediate.addIndex(EOpIndexDirect, argValue, idxConst, loc);
                    const TType indexType(argValue->getType(), 0);
                    rValue->setType(indexType);
                }

                TIntermTyped* assign = intermediate.addAssign(EOpAssign, lValue, rValue, loc);

                body = intermediate.growAggregate(body, assign);
            }

            body->setOperator(EOpSequence);
            node = body;
        }

        break;

    case EOpMethodGetDimensions:
        {
            const int numArgs = (int)argAggregate->getSequence().size();
            TIntermTyped* argNumItems = argAggregate->getSequence()[1]->getAsTyped();  // out num items
            TIntermTyped* argStride   = numArgs > 2 ? argAggregate->getSequence()[2]->getAsTyped() : nullptr;  // out stride

            TIntermAggregate* body = nullptr;

            // Length output:
            if (argArray->getType().isSizedArray()) {
                const int length = argArray->getType().getOuterArraySize();
                TIntermTyped* assign = intermediate.addAssign(EOpAssign, argNumItems,
                                                              intermediate.addConstantUnion(length, loc, true), loc);
                body = intermediate.growAggregate(body, assign, loc);
            } else {
                TIntermTyped* lengthCall = intermediate.addBuiltInFunctionCall(loc, EOpArrayLength, true, argArray,
                                                                               argNumItems->getType());
                TIntermTyped* assign = intermediate.addAssign(EOpAssign, argNumItems, lengthCall, loc);
                body = intermediate.growAggregate(body, assign, loc);
            }

            // Stride output:
            if (argStride != nullptr) {
                int size;
                int stride;
                intermediate.getMemberAlignment(argArray->getType(), size, stride, argArray->getType().getQualifier().layoutPacking,
                                                argArray->getType().getQualifier().layoutMatrix == ElmRowMajor);

                TIntermTyped* assign = intermediate.addAssign(EOpAssign, argStride,
                                                              intermediate.addConstantUnion(stride, loc, true), loc);

                body = intermediate.growAggregate(body, assign);
            }

            body->setOperator(EOpSequence);
            node = body;
        }

        break;

    case EOpInterlockedAdd:
    case EOpInterlockedAnd:
    case EOpInterlockedExchange:
    case EOpInterlockedMax:
    case EOpInterlockedMin:
    case EOpInterlockedOr:
    case EOpInterlockedXor:
    case EOpInterlockedCompareExchange:
    case EOpInterlockedCompareStore:
        {
            // We'll replace the first argument with the block dereference, and let
            // downstream decomposition handle the rest.

            TIntermSequence& sequence = argAggregate->getSequence();

            TIntermTyped* argIndex     = makeIntegerIndex(sequence[1]->getAsTyped());  // index
            argIndex = intermediate.addBinaryNode(EOpRightShift, argIndex, intermediate.addConstantUnion(2, loc, true),
                                                  loc, TType(EbtInt));

            const TOperator idxOp = (argIndex->getQualifier().storage == EvqConst) ? EOpIndexDirect : EOpIndexIndirect;
            TIntermTyped* element = intermediate.addIndex(idxOp, argArray, argIndex, loc);

            const TType derefType(argArray->getType(), 0);
            element->setType(derefType);

            // Replace the numeric byte offset parameter with array reference.
            sequence[1] = element;
            sequence.erase(sequence.begin(), sequence.begin()+1);
        }
        break;

    case EOpMethodIncrementCounter:
        {
            node = incDecCounter(1);
            break;
        }

    case EOpMethodDecrementCounter:
        {
            TIntermTyped* preIncValue = incDecCounter(-1); // result is original value
            node = intermediate.addBinaryNode(EOpAdd, preIncValue, intermediate.addConstantUnion(-1, loc, true), loc,
                                              preIncValue->getType());
            break;
        }

    case EOpMethodAppend:
        {
            TIntermTyped* oldCounter = incDecCounter(1);

            TIntermTyped* lValue = intermediate.addIndex(EOpIndexIndirect, argArray, oldCounter, loc);
            TIntermTyped* rValue = argAggregate->getSequence()[1]->getAsTyped();

            const TType derefType(argArray->getType(), 0);
            lValue->setType(derefType);

            node = intermediate.addAssign(EOpAssign, lValue, rValue, loc);

            break;
        }

    case EOpMethodConsume:
        {
            TIntermTyped* oldCounter = incDecCounter(-1);

            TIntermTyped* newCounter = intermediate.addBinaryNode(EOpAdd, oldCounter,
                                                                  intermediate.addConstantUnion(-1, loc, true), loc,
                                                                  oldCounter->getType());

            node = intermediate.addIndex(EOpIndexIndirect, argArray, newCounter, loc);

            const TType derefType(argArray->getType(), 0);
            node->setType(derefType);

            break;
        }

    default:
        break; // most pass through unchanged
    }
}